

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall RawRCONConsoleCommand::trigger(RawRCONConsoleCommand *this,string_view parameters)

{
  ostream *poVar1;
  Server **server;
  undefined8 *puVar2;
  allocator<char> local_59;
  undefined8 *local_58;
  undefined8 *local_50;
  string msg;
  string_view parameters_local;
  
  parameters_local._M_str = parameters._M_str;
  parameters_local._M_len = parameters._M_len;
  if (parameters_local._M_len != 0) {
    RenX::getCore();
    RenX::Core::getServers();
    if (local_58 == local_50) {
      poVar1 = std::operator<<((ostream *)&std::cout,
                               "Error: Not connected to any Renegade X servers.");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&msg,&parameters_local,&local_59);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&msg,'\n');
      for (puVar2 = local_58; puVar2 != local_50; puVar2 = puVar2 + 1) {
        RenX::Server::sendData(*puVar2,msg._M_string_length,msg._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
    std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
              ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_58);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Error: Too Few Parameters. Syntax: rrcon <input>")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void RawRCONConsoleCommand::trigger(std::string_view parameters) {
	if (parameters.empty()) {
		std::cout << "Error: Too Few Parameters. Syntax: rrcon <input>" << std::endl;
		return;
	}

	const auto& servers = RenX::getCore()->getServers();
	if (servers.empty()) {
		std::cout << "Error: Not connected to any Renegade X servers." << std::endl;
		return;
	}

	std::string msg{ parameters };
	msg += '\n';
	for (const auto& server : servers) {
		server->sendData(msg);
	}
}